

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getExpectedValue_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  reference pvVar1;
  TestError *this_00;
  char *__s;
  float local_24;
  GLfloat value;
  testCase *test_case;
  InitializerListTest *this_local;
  string *expected_value;
  
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ::operator[](&this->m_test_cases,(long)this->m_current_test_case_index);
  switch(pvVar1->m_initializer) {
  case VECTOR:
  case MATRIX:
  case MATRIX_ROWS:
    local_24 = (float)(pvVar1->m_n_cols * pvVar1->m_n_rows);
    break;
  case STRUCT:
    local_24 = 8.0;
    break;
  case ARRAY_SCALAR:
  case UNSIZED_ARRAY_SCALAR:
    local_24 = 4.0;
    break;
  case ARRAY_VECTOR_CTR:
  case ARRAY_VECTOR_LIST:
  case ARRAY_MATRIX_CTR:
  case ARRAY_MATRIX_LIST:
  case UNSIZED_ARRAY_VECTOR:
  case UNSIZED_ARRAY_MATRIX:
    local_24 = (float)(pvVar1->m_n_cols * pvVar1->m_n_rows) * 4.0;
    break;
  case ARRAY_STRUCT:
  case UNSIZED_ARRAY_STRUCT:
    local_24 = 32.0;
    break;
  case NESTED_STRUCT_CTR:
  case NESTED_STRUCT_LIST:
    local_24 = 12.0;
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    local_24 = 28.0;
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    local_24 = 48.0;
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    local_24 = 16.0;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x35df);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,'@');
  __s = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  sprintf(__s,"%f",(double)(local_24 * 0.0625));
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getExpectedValue()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	GLfloat value = 0.0f;

	switch (test_case.m_initializer)
	{
	case VECTOR:
	case MATRIX:
	case MATRIX_ROWS:
		value = (GLfloat)(test_case.m_n_cols * test_case.m_n_rows);
		break;
	case ARRAY_VECTOR_CTR:
	case ARRAY_VECTOR_LIST:
	case ARRAY_MATRIX_CTR:
	case ARRAY_MATRIX_LIST:
	case UNSIZED_ARRAY_VECTOR:
	case UNSIZED_ARRAY_MATRIX:
		value = (GLfloat)(test_case.m_n_cols * test_case.m_n_rows) * 4.0f;
		break;
	case ARRAY_SCALAR:
	case UNSIZED_ARRAY_SCALAR:
		value = 4.0f;
		break;
	case STRUCT:
		value = 8.0f;
		break;
	case NESTED_STRUCT_CTR:
	case NESTED_STRUCT_LIST:
		value = 12.0f;
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		value = 16.0f;
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		value = 28.0f;
		break;
	case ARRAY_STRUCT:
	case UNSIZED_ARRAY_STRUCT:
		value = 32.0f;
		break;
	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		value = 48.0f;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	value *= m_value;

	std::string expected_value;
	expected_value.resize(64, 0);

	sprintf(&expected_value[0], "%f", value);

	return expected_value;
}